

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int __thiscall
DeviceTy::deallocTgtPtr(DeviceTy *this,void *HstPtrBegin,int64_t Size,bool ForceDelete)

{
  long lVar1;
  undefined1 in_CL;
  void *in_RDX;
  DeviceTy *in_RSI;
  mutex *in_RDI;
  HostDataToTargetTy *HT;
  LookupResult lr;
  int rc;
  const_iterator in_stack_ffffffffffffffb8;
  _List_const_iterator<HostDataToTargetTy> local_40;
  reference local_38;
  LookupResult local_30;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  std::mutex::lock(in_RDI);
  local_30 = lookupMapping(in_RSI,in_RDX,CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  if (((((undefined1  [16])local_30 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (((byte)local_30.Flags._0_1_ >> 1 & 1) == 0)) && (((byte)local_30.Flags._0_1_ >> 2 & 1) == 0))
  {
    iVar2 = -1;
  }
  else {
    local_38 = std::_List_iterator<HostDataToTargetTy>::operator*
                         ((_List_iterator<HostDataToTargetTy> *)0x103a10);
    if ((uVar3 & 0x1000000) != 0) {
      local_38->RefCount = 1;
    }
    lVar1 = local_38->RefCount + -1;
    local_38->RefCount = lVar1;
    if (lVar1 < 1) {
      (**(code **)(*(long *)((long)&(in_RDI->super___mutex_base)._M_mutex + 8) + 0x48))
                ((in_RDI->super___mutex_base)._M_mutex.__data.__kind,local_38->TgtPtrBegin);
      std::_List_const_iterator<HostDataToTargetTy>::_List_const_iterator(&local_40,&local_30.Entry)
      ;
      std::__cxx11::list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>::erase
                ((list<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)in_RDI,
                 in_stack_ffffffffffffffb8);
    }
    iVar2 = 0;
  }
  std::mutex::unlock((mutex *)0x103ab1);
  return iVar2;
}

Assistant:

int DeviceTy::deallocTgtPtr(void *HstPtrBegin, int64_t Size, bool ForceDelete) {
  // Check if the pointer is contained in any sub-nodes.
  int rc;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);
  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    if (ForceDelete)
      HT.RefCount = 1;
    if (--HT.RefCount <= 0) {
      assert(HT.RefCount == 0 && "did not expect a negative ref count");
      DP("Deleting tgt data " DPxMOD " of size %ld\n",
          DPxPTR(HT.TgtPtrBegin), Size);
      RTL->data_delete(RTLDeviceID, (void *)HT.TgtPtrBegin);
      DP("Removing%s mapping with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD
          ", Size=%ld\n", (ForceDelete ? " (forced)" : ""),
          DPxPTR(HT.HstPtrBegin), DPxPTR(HT.TgtPtrBegin), Size);
      HostDataToTargetMap.erase(lr.Entry);
    }
    rc = OFFLOAD_SUCCESS;
  } else {
    DP("Section to delete (hst addr " DPxMOD ") does not exist in the allocated"
       " memory\n", DPxPTR(HstPtrBegin));
    rc = OFFLOAD_FAIL;
  }

  DataMapMtx.unlock();
  return rc;
}